

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
llvm::cl::parser<float>::printOptionDiff
          (parser<float> *this,Option *O,float V,OptionValue<float> *D,size_t GlobalWidth)

{
  OptionValue<float> OVar1;
  raw_ostream *prVar2;
  float *pfVar3;
  uint NumSpaces;
  string Str;
  raw_string_ostream SS;
  
  basic_parser_impl::printOptionName((basic_parser_impl *)this,O,GlobalWidth);
  Str._M_dataplus._M_p = (pointer)&Str.field_2;
  Str._M_string_length = 0;
  Str.field_2._M_local_buf[0] = '\0';
  SS.super_raw_ostream.BufferMode = InternalBuffer;
  SS.super_raw_ostream.OutBufCur = (char *)0x0;
  SS.super_raw_ostream.OutBufStart = (char *)0x0;
  SS.super_raw_ostream.OutBufEnd = (char *)0x0;
  SS.super_raw_ostream._vptr_raw_ostream = (_func_int **)&PTR__raw_string_ostream_00229cf0;
  SS.OS = &Str;
  raw_ostream::operator<<(&SS.super_raw_ostream,(double)V);
  raw_string_ostream::~raw_string_ostream(&SS);
  prVar2 = outs();
  prVar2 = raw_ostream::operator<<(prVar2,"= ");
  raw_ostream::operator<<(prVar2,&Str);
  NumSpaces = 0;
  if (Str._M_string_length < 8) {
    NumSpaces = 8 - (int)Str._M_string_length;
  }
  prVar2 = outs();
  prVar2 = raw_ostream::indent(prVar2,NumSpaces);
  raw_ostream::operator<<(prVar2," (default: ");
  OVar1 = D[0xc];
  prVar2 = outs();
  if (OVar1 == (OptionValue<float>)0x1) {
    pfVar3 = OptionValueCopy<float>::getValue((OptionValueCopy<float> *)D);
    raw_ostream::operator<<(prVar2,(double)*pfVar3);
  }
  else {
    raw_ostream::operator<<(prVar2,"*no default*");
  }
  prVar2 = outs();
  raw_ostream::operator<<(prVar2,")\n");
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void parser<std::string>::printOptionDiff(const Option &O, StringRef V,
                                          const OptionValue<std::string> &D,
                                          size_t GlobalWidth) const {
  printOptionName(O, GlobalWidth);
  outs() << "= " << V;
  size_t NumSpaces = MaxOptWidth > V.size() ? MaxOptWidth - V.size() : 0;
  outs().indent(NumSpaces) << " (default: ";
  if (D.hasValue())
    outs() << D.getValue();
  else
    outs() << "*no default*";
  outs() << ")\n";
}